

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_NonNullTerminatedFormatString_Test::TestBody
          (FormatTest_NonNullTerminatedFormatString_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  basic_string_view<char> *this_01;
  string *expected_expression;
  int line;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  basic_string_view<char> *in_stack_ffffffffffffffb8;
  string local_38 [32];
  Message *in_stack_ffffffffffffffe8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffff0;
  
  this_01 = (basic_string_view<char> *)&stack0xffffffffffffffb8;
  fmt::v5::basic_string_view<char>::basic_string_view(this_01,"{}foo",2);
  expected_expression = local_38;
  fmt::v5::format<fmt::v5::basic_string_view<char>,int>
            (in_stack_ffffffffffffffb8,(int *)CONCAT44(0x2a,in_stack_ffffffffffffffb0));
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)expected_expression,(char *)this_01,
             (char (*) [3])CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  line = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x17e599)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,line,
               (char *)this_01);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffff0.ptr_,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x17e5e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e62a);
  return;
}

Assistant:

TEST(FormatTest, NonNullTerminatedFormatString) {
  EXPECT_EQ("42", format(string_view("{}foo", 2), 42));
}